

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall OpenMPOrderedDirective::OpenMPOrderedDirective(OpenMPOrderedDirective *this)

{
  _Rb_tree_header *p_Var1;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar2;
  
  (this->super_OpenMPDirective).super_SourceLocation.line = 0;
  (this->super_OpenMPDirective).super_SourceLocation.column = 0;
  (this->super_OpenMPDirective).super_SourceLocation.parent_construct = (SourceLocation *)0x0;
  (this->super_OpenMPDirective).kind = OMPD_ordered;
  (this->super_OpenMPDirective).lang = Lang_unknown;
  pvVar2 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_OpenMPDirective).clauses_in_original_order = pvVar2;
  p_Var1 = &(this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header;
  (this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_OpenMPDirective).clauses._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

OpenMPOrderedDirective() : OpenMPDirective(OMPD_ordered) { }